

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O2

void emtlst(emtcxdef *ctx,uint ofs,uchar *base)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uchar *puVar5;
  uint16_t tmp_2;
  ushort uVar6;
  uint uVar7;
  uint *puVar8;
  bool bVar9;
  
  uVar2 = ctx->emtcxofs;
  emtres(ctx,2);
  puVar5 = ctx->emtcxptr;
  uVar6 = ctx->emtcxofs;
  (puVar5 + uVar6)[0] = '\x02';
  (puVar5 + uVar6)[1] = '\0';
  ctx->emtcxofs = ctx->emtcxofs + 2;
  if (ofs != 0) {
    uVar6 = *(ushort *)(base + ofs);
    puVar8 = (uint *)(base + (ulong)uVar6 * 0x10 + (ulong)ofs);
    while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
      cVar1 = (char)puVar8[-2];
      uVar7 = 0xd;
      switch(cVar1) {
      case '@':
        goto switchD_0011f720_caseD_40;
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'G':
      case 'H':
      case 'J':
      case 'K':
switchD_0011f720_caseD_41:
        emtres(ctx,1);
        uVar3 = ctx->emtcxofs;
        ctx->emtcxofs = uVar3 + 1;
        ctx->emtcxptr[uVar3] = (uchar)ofs;
        if (((uchar)ofs != '\x05') && ((ofs & 0xff) != 8)) {
LAB_0011f843:
          emtres(ctx,4);
          *(uint *)(ctx->emtcxptr + ctx->emtcxofs) = *puVar8;
          ctx->emtcxofs = ctx->emtcxofs + 4;
        }
        break;
      case 'F':
        uVar7 = 10;
        goto switchD_0011f720_caseD_40;
      case 'I':
        uVar7 = 2;
switchD_0011f720_caseD_40:
        emtres(ctx,1);
        uVar3 = ctx->emtcxofs;
        ctx->emtcxofs = uVar3 + 1;
        ctx->emtcxptr[uVar3] = (uchar)uVar7;
        emtres(ctx,2);
        *(short *)(ctx->emtcxptr + ctx->emtcxofs) = (short)*puVar8;
        ctx->emtcxofs = ctx->emtcxofs + 2;
        ofs = uVar7;
        break;
      case 'L':
        emtres(ctx,1);
        uVar3 = ctx->emtcxofs;
        ctx->emtcxofs = uVar3 + 1;
        ctx->emtcxptr[uVar3] = '\a';
        emtlst(ctx,*puVar8,base);
        break;
      case 'M':
        ofs = 5;
        goto LAB_0011f7ff;
      case 'N':
        ofs = 8;
LAB_0011f7ff:
        emtres(ctx,1);
        uVar3 = ctx->emtcxofs;
        ctx->emtcxofs = uVar3 + 1;
        ctx->emtcxptr[uVar3] = (uchar)ofs;
        break;
      default:
        if (cVar1 != '6') {
          if (cVar1 == '7') {
            emtres(ctx,1);
            uVar3 = ctx->emtcxofs;
            ctx->emtcxofs = uVar3 + 1;
            ctx->emtcxptr[uVar3] = '\x01';
            ofs = 1;
            goto LAB_0011f843;
          }
          if (cVar1 != 'U') goto switchD_0011f720_caseD_41;
          goto switchD_0011f720_caseD_40;
        }
        uVar3 = *(ushort *)(base + *(long *)puVar8);
        emtres(ctx,1);
        uVar4 = ctx->emtcxofs;
        ctx->emtcxofs = uVar4 + 1;
        ctx->emtcxptr[uVar4] = '\x03';
        emtres(ctx,uVar3);
        memcpy(ctx->emtcxptr + ctx->emtcxofs,base + *(long *)puVar8,(ulong)uVar3);
        ctx->emtcxofs = ctx->emtcxofs + uVar3;
      }
      puVar8 = puVar8 + -4;
    }
    *(ushort *)(ctx->emtcxptr + uVar2) = ctx->emtcxofs - uVar2;
  }
  return;
}

Assistant:

void emtlst(emtcxdef *ctx, uint ofs, uchar *base)
{
    uint      initofs;
    ushort    i;
    emtlidef *lst;
    emtledef *ele;
        
    initofs = ctx->emtcxofs;                        /* save starting offset */
    emtint2(ctx, 2);                             /* emit placeholder length */
    if (ofs == 0) return;              /* nothing more to do for empty list */

    lst = (emtlidef *)(base + ofs);

    for (i = lst->emtlicnt, ele = &lst->emtliele[i-1] ; i ; --ele, --i)
    {
        uchar dat;
        
        switch(ele->emtletyp)
        {
        case TOKTLIST:
            emtbyte(ctx, DAT_LIST);
            emtlst(ctx, (uint)ele->emtleval, base);
            continue;

        case TOKTSSTRING:
        {
            uint oplen = osrp2(base + ele->emtleval);
            
            emtbyte(ctx, DAT_SSTRING);
            emtmem(ctx, base + ele->emtleval, oplen);
            continue;
        }

        case TOKTNUMBER:
            dat = DAT_NUMBER;
            break;
        case TOKTNIL:
            dat = DAT_NIL;
            break;
        case TOKTTRUE:
            dat = DAT_TRUE;
            break;

        case TOKTPOUND:
            dat = DAT_PROPNUM;
            goto symbol;
        case TOKTFUNCTION:
            dat = DAT_FNADDR;
            goto symbol;
        case TOKTOBJECT:
            dat = DAT_OBJECT;
            goto symbol;
        case TOKTDOT:
            dat = DAT_PROPNUM;
            /* FALLTHROUGH */
        symbol:
            emtbyte(ctx, dat);
            emtint2(ctx, (ushort)ele->emtleval);
            continue;

        default:
            assert(FALSE);
            break;
        }
        
        /* if we get here, emit datatype in dat, plus value */
        emtbyte(ctx, dat);
        if (dat != DAT_TRUE && dat != DAT_NIL)
            emtint4(ctx, ele->emtleval);
    }
    oswp2(ctx->emtcxptr + initofs, ctx->emtcxofs - initofs);
}